

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

size_t testing::internal::GetThreadCount(void)

{
  ostream *this;
  __pid_t _Var1;
  size_t sVar2;
  int iVar3;
  long in_FS_OFFSET;
  string filename;
  ifstream file;
  string dummy;
  int local_274;
  string local_270;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250 [65];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)local_250);
  this = (ostream *)(local_250[0].ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(this,"/proc/",6);
  _Var1 = getpid();
  std::ostream::operator<<((ostream *)this,_Var1);
  std::__ostream_insert<char,std::char_traits<char>>(this,"/stat",5);
  StringStreamToString(&local_270,local_250[0].ptr_);
  if (local_250[0].ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_250[0].ptr_ + 8))(local_250[0].ptr_);
  }
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  std::ifstream::ifstream(local_250,local_270._M_dataplus._M_p,_S_in);
  iVar3 = -0x14;
  while (iVar3 = iVar3 + 1, iVar3 != 0) {
    std::operator>>((istream *)local_250,(string *)&local_48);
  }
  local_274 = 0;
  std::istream::operator>>((istream *)local_250,&local_274);
  sVar2 = (size_t)local_274;
  std::ifstream::~ifstream(local_250);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}